

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

bool __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           *this,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f,
          function_buffer *functor)

{
  ulong __n;
  bool bVar1;
  undefined8 ****__dest;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *__src;
  undefined8 ***local_40 [2];
  ulong local_30;
  token_compress_mode_type local_28;
  
  __n = (f->m_Pred).m_Size;
  local_40[0] = (undefined8 ****)0x0;
  local_30 = __n;
  if (__n < 0x11) {
    __dest = local_40;
    __src = f;
  }
  else {
    __dest = (undefined8 ****)operator_new__(__n);
    __src = (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)
            (f->m_Pred).m_Storage.m_dynSet;
    local_40[0] = __dest;
  }
  memcpy(__dest,__src,__n);
  local_28 = f->m_eCompress;
  bVar1 = assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
                    (this,local_40,functor);
  if ((0x10 < local_30) && ((undefined8 ****)local_40[0] != (undefined8 ****)0x0)) {
    operator_delete__(local_40[0]);
  }
  return bVar1;
}

Assistant:

bool assign_to(F f, function_buffer& functor) const
        {
          typedef typename get_function_tag<F>::type tag;
          return assign_to(f, functor, tag());
        }